

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

aiColor4D __thiscall Assimp::XFileParser::ReadRGBA(XFileParser *this)

{
  ai_real aVar1;
  ai_real aVar2;
  ai_real aVar3;
  aiColor4D aVar4;
  
  aVar4.r = ReadFloat(this);
  aVar1 = ReadFloat(this);
  aVar2 = ReadFloat(this);
  aVar3 = ReadFloat(this);
  TestForSeparator(this);
  aVar4.a = aVar3;
  aVar4.b = aVar2;
  aVar4.g = aVar1;
  return aVar4;
}

Assistant:

aiColor4D XFileParser::ReadRGBA()
{
    aiColor4D color;
    color.r = ReadFloat();
    color.g = ReadFloat();
    color.b = ReadFloat();
    color.a = ReadFloat();
    TestForSeparator();

    return color;
}